

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::expand_root
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int key,bool expand_left)

{
  self_type *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int left;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  AlexNode<int,_int> **ppAVar9;
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *pAVar10;
  uint *puVar11;
  ulong uVar12;
  byte in_DL;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_RDI;
  bool bVar13;
  data_node_type *first_new_leaf;
  data_node_type *last_new_leaf;
  int j_1;
  data_node_type *new_node_1;
  int left_boundary_1;
  int i_2;
  data_node_type *prev;
  int right_boundary_1;
  int right_boundary_value;
  int j;
  data_node_type *new_node;
  int right_boundary;
  int i_1;
  data_node_type *next;
  int left_boundary;
  int left_boundary_value;
  uint8_t new_node_duplication_factor;
  int n;
  int in_bounds_new_nodes_end;
  int in_bounds_new_nodes_start;
  model_node_type *new_root;
  int i;
  int copy_start;
  AlexNode<int,_int> **new_children;
  int new_num_children;
  int new_nodes_end;
  int new_nodes_start;
  int half_expanded_domain_size_1;
  int half_expandable_domain_1;
  int key_difference_1;
  int half_expanded_domain_size;
  int half_expandable_domain;
  int key_difference;
  data_node_type *outermost_node;
  int new_domain_max;
  int new_domain_min;
  int expansion_factor;
  int domain_size;
  model_node_type *root;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffe9c;
  short in_stack_fffffffffffffe9e;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined1 *in_stack_fffffffffffffea8;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *in_stack_fffffffffffffeb0;
  uint local_fc;
  data_node_type *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  data_node_type *pdVar14;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  data_node_type *in_stack_ffffffffffffff30;
  int local_c4;
  data_node_type *local_c0;
  int local_a4;
  int local_a0;
  int local_9c;
  uint local_98;
  undefined1 local_92 [2];
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *local_90;
  int local_84;
  int local_80;
  AlexNode<int,_int> **local_68;
  int local_5c;
  int local_58;
  uint local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  data_node_type *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *local_18;
  byte local_d;
  int local_c [3];
  
  local_d = in_DL & 1;
  local_18 = (AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)in_RDI->root_node_;
  local_1c = (in_RDI->istats_).key_domain_max_ - (in_RDI->istats_).key_domain_min_;
  local_24 = (in_RDI->istats_).key_domain_min_;
  local_28 = (in_RDI->istats_).key_domain_max_;
  if (local_d == 0) {
    local_48 = get_max_key((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                            *)0x176583);
    piVar7 = std::max<int>(local_c,&local_48);
    local_44 = *piVar7 - (in_RDI->istats_).key_domain_max_;
    local_20 = pow_2_round_up((local_44 + local_1c + -1) / local_1c + 1);
    iVar3 = std::numeric_limits<int>::max();
    local_4c = iVar3 / 2 - (in_RDI->istats_).key_domain_min_ / 2;
    local_50 = (local_20 / 2) * local_1c;
    if (local_4c < local_50) {
      local_28 = std::numeric_limits<int>::max();
    }
    else {
      local_28 = local_50 * 2 + (in_RDI->istats_).key_domain_min_;
    }
    (in_RDI->istats_).num_keys_at_last_right_domain_resize = (in_RDI->stats_).num_keys;
    (in_RDI->istats_).num_keys_above_key_domain = 0;
    local_30 = last_data_node(in_RDI);
  }
  else {
    iVar3 = (in_RDI->istats_).key_domain_min_;
    local_38 = get_min_key((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                            *)0x176448);
    piVar7 = std::min<int>(local_c,&local_38);
    local_34 = iVar3 - *piVar7;
    local_20 = pow_2_round_up((local_34 + local_1c + -1) / local_1c + 1);
    iVar3 = (in_RDI->istats_).key_domain_max_;
    iVar2 = std::numeric_limits<int>::lowest();
    local_3c = iVar3 / 2 - iVar2 / 2;
    local_40 = (local_20 / 2) * local_1c;
    if (local_3c < local_40) {
      local_24 = std::numeric_limits<int>::lowest();
    }
    else {
      local_24 = (in_RDI->istats_).key_domain_max_ + local_40 * -2;
    }
    (in_RDI->istats_).num_keys_at_last_left_domain_resize = (in_RDI->stats_).num_keys;
    (in_RDI->istats_).num_keys_below_key_domain = 0;
    local_30 = first_data_node(in_RDI);
  }
  if (local_20 < 2) {
    __assert_fail("expansion_factor > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                  ,0x589,
                  "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::expand_root(T, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                 );
  }
  uVar8 = (long)local_18->num_children_ * (long)local_20;
  uVar12 = (ulong)(in_RDI->derived_params_).max_fanout;
  if (uVar8 < uVar12 || uVar8 - uVar12 == 0) {
    (in_RDI->stats_).num_model_node_expansions = (in_RDI->stats_).num_model_node_expansions + 1;
    (in_RDI->stats_).num_model_node_expansion_pointers =
         (in_RDI->stats_).num_model_node_expansion_pointers + (long)local_18->num_children_;
    local_5c = local_18->num_children_ * local_20;
    pointer_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                       *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    ppAVar9 = __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                        ((new_allocator<alex::AlexNode<int,_int>_*> *)
                         CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                         CONCAT26(in_stack_fffffffffffffe9e,
                                  CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
                         (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    std::allocator<alex::AlexNode<int,_int>_*>::~allocator
              ((allocator<alex::AlexNode<int,_int>_*> *)0x176780);
    if ((local_d & 1) == 0) {
      local_80 = 0;
      local_54 = local_18->num_children_;
      local_58 = local_5c;
    }
    else {
      local_80 = local_5c - local_18->num_children_;
      local_54 = 0;
      (local_18->super_AlexNode<int,_int>).model_.b_ =
           (double)(local_5c - local_18->num_children_) +
           (local_18->super_AlexNode<int,_int>).model_.b_;
      local_58 = local_80;
    }
    for (local_84 = 0; local_84 < local_18->num_children_; local_84 = local_84 + 1) {
      ppAVar9[local_80 + local_84] = local_18->children_[local_84];
    }
    local_68 = ppAVar9;
    pointer_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                       *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::deallocate
              ((new_allocator<alex::AlexNode<int,_int>_*> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
               (AlexNode<int,_int> **)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               0x1768e6);
    std::allocator<alex::AlexNode<int,_int>_*>::~allocator
              ((allocator<alex::AlexNode<int,_int>_*> *)0x1768f3);
    local_18->children_ = local_68;
    local_18->num_children_ = local_5c;
  }
  else {
    model_node_allocator
              ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    pAVar10 = __gnu_cxx::
              new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
              allocate((new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       CONCAT26(in_stack_fffffffffffffe9e,
                                CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
                       (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::AlexModelNode
              ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9e,
               (allocator<std::pair<int,_int>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
    ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *)
               0x176985);
    (pAVar10->super_AlexNode<int,_int>).model_.a_ =
         (local_18->super_AlexNode<int,_int>).model_.a_ / (double)local_18->num_children_;
    (pAVar10->super_AlexNode<int,_int>).model_.b_ =
         (local_18->super_AlexNode<int,_int>).model_.b_ / (double)local_18->num_children_;
    if ((local_d & 1) != 0) {
      (pAVar10->super_AlexNode<int,_int>).model_.b_ =
           (double)(local_20 + -1) + (pAVar10->super_AlexNode<int,_int>).model_.b_;
    }
    pAVar10->num_children_ = local_20;
    in_stack_fffffffffffffea8 = local_92;
    local_90 = pAVar10;
    pointer_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                       *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    in_stack_fffffffffffffeb0 =
         (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *)
         __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                   ((new_allocator<alex::AlexNode<int,_int>_*> *)
                    CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                    CONCAT26(in_stack_fffffffffffffe9e,
                             CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
                    (void *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    local_90->children_ = (AlexNode<int,_int> **)in_stack_fffffffffffffeb0;
    std::allocator<alex::AlexNode<int,_int>_*>::~allocator
              ((allocator<alex::AlexNode<int,_int>_*> *)0x176a9e);
    bVar13 = (local_d & 1) == 0;
    if (bVar13) {
      *local_90->children_ = &local_18->super_AlexNode<int,_int>;
    }
    else {
      local_90->children_[local_20 + -1] = &local_18->super_AlexNode<int,_int>;
    }
    local_54 = (uint)bVar13;
    local_58 = local_54 + local_20 + -1;
    in_RDI->root_node_ = &local_90->super_AlexNode<int,_int>;
    update_superroot_pointer(in_RDI);
    local_18 = local_90;
  }
  local_98 = local_54;
  local_9c = local_58;
  if ((local_d & 1) == 0) {
    local_a4 = LinearModel<int>::predict(&(local_18->super_AlexNode<int,_int>).model_,local_28);
    local_a4 = local_a4 + 1;
    piVar7 = std::min<int>(&local_58,&local_a4);
    local_9c = *piVar7;
  }
  else {
    local_a0 = LinearModel<int>::predict(&(local_18->super_AlexNode<int,_int>).model_,local_24);
    puVar11 = (uint *)std::max<int>((int *)&local_54,&local_a0);
    local_98 = *puVar11;
  }
  iVar3 = local_18->num_children_ - (local_58 - local_54);
  if (local_18->num_children_ % iVar3 != 0) {
    __assert_fail("root->num_children_ % n == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                  ,0x5d2,
                  "void alex::Alex<int, int, alex::AlexCompare, std::allocator<std::pair<int, int>>, false>::expand_root(T, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = false]"
                 );
  }
  iVar2 = log_2_round_down(iVar3);
  if ((local_d & 1) == 0) {
    iVar5 = (in_RDI->istats_).key_domain_max_;
    iVar4 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
            lower_bound<int>((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                              *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                             (int *)CONCAT26(in_stack_fffffffffffffe9e,
                                             CONCAT24(in_stack_fffffffffffffe9c,
                                                      in_stack_fffffffffffffe98)));
    pdVar14 = (data_node_type *)0x0;
    for (uVar6 = local_54; (int)uVar6 < local_58; uVar6 = iVar3 + uVar6) {
      if ((int)(uVar6 + iVar3) < local_9c) {
        iVar5 = local_1c + iVar5;
        left = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               ::lower_bound<int>((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                                   *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                                  (int *)CONCAT26(in_stack_fffffffffffffe9e,
                                                  CONCAT24(in_stack_fffffffffffffe9c,
                                                           in_stack_fffffffffffffe98)));
      }
      else {
        left = local_30->data_capacity_;
      }
      in_stack_fffffffffffffe98 = 0;
      in_stack_ffffffffffffff08 =
           bulk_load_leaf_node_from_existing
                     ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                       *)in_stack_ffffffffffffff30,
                      (data_node_type *)CONCAT44(in_stack_ffffffffffffff2c,iVar5),left,
                      in_stack_ffffffffffffff20,SUB81((ulong)pdVar14 >> 0x38,0),
                      (FTNode *)CONCAT44(uVar6,iVar4),
                      SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0),
                      SUB81((ulong)in_stack_ffffffffffffff08 >> 0x30,0),
                      SUB81((ulong)in_stack_ffffffffffffff08 >> 0x28,0));
      (in_stack_ffffffffffffff08->super_AlexNode<int,_int>).level_ =
           (local_18->super_AlexNode<int,_int>).level_ + 1;
      (in_stack_ffffffffffffff08->super_AlexNode<int,_int>).duplication_factor_ = (uint8_t)iVar2;
      if (pdVar14 != (data_node_type *)0x0) {
        pdVar14->next_leaf_ = in_stack_ffffffffffffff08;
      }
      in_stack_ffffffffffffff08->prev_leaf_ = pdVar14;
      for (local_fc = uVar6; (int)local_fc < (int)(uVar6 + iVar3); local_fc = local_fc + 1) {
        local_18->children_[(int)local_fc] = &in_stack_ffffffffffffff08->super_AlexNode<int,_int>;
      }
      pdVar14 = in_stack_ffffffffffffff08;
      iVar4 = left;
    }
  }
  else {
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
    lower_bound<int>((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                      *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     (int *)CONCAT26(in_stack_fffffffffffffe9e,
                                     CONCAT24(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)))
    ;
    local_c0 = local_30;
    for (local_c4 = local_58; (int)local_54 < local_c4; local_c4 = local_c4 - iVar3) {
      if ((int)local_98 < local_c4 - iVar3) {
        AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
        lower_bound<int>((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                          *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                         (int *)CONCAT26(in_stack_fffffffffffffe9e,
                                         CONCAT24(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98)));
      }
      in_stack_fffffffffffffe98 = 0;
      in_stack_ffffffffffffff30 =
           bulk_load_leaf_node_from_existing
                     ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                       *)in_stack_ffffffffffffff30,
                      (data_node_type *)
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                      SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),
                      (FTNode *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0),
                      SUB81((ulong)in_stack_ffffffffffffff08 >> 0x30,0),
                      SUB81((ulong)in_stack_ffffffffffffff08 >> 0x28,0));
      (in_stack_ffffffffffffff30->super_AlexNode<int,_int>).level_ =
           (local_18->super_AlexNode<int,_int>).level_ + 1;
      (in_stack_ffffffffffffff30->super_AlexNode<int,_int>).duplication_factor_ = (uint8_t)iVar2;
      if (local_c0 != (data_node_type *)0x0) {
        local_c0->prev_leaf_ = in_stack_ffffffffffffff30;
      }
      in_stack_ffffffffffffff30->next_leaf_ = local_c0;
      in_stack_ffffffffffffff2c = local_c4;
      while (in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c + -1,
            local_c4 - iVar3 <= in_stack_ffffffffffffff2c) {
        local_18->children_[in_stack_ffffffffffffff2c] =
             &in_stack_ffffffffffffff30->super_AlexNode<int,_int>;
      }
      local_c0 = in_stack_ffffffffffffff30;
    }
  }
  iVar3 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  if ((local_d & 1) == 0) {
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
    erase_range(in_stack_fffffffffffffeb0,iVar3,(int)in_stack_fffffffffffffea8,
                (bool)in_stack_fffffffffffffea7);
    psVar1 = (self_type *)local_18->children_[(int)local_54];
    local_30->next_leaf_ = psVar1;
    psVar1->prev_leaf_ = local_30;
  }
  else {
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
    erase_range(in_stack_fffffffffffffeb0,iVar3,(int)in_stack_fffffffffffffea8,
                (bool)in_stack_fffffffffffffea7);
    psVar1 = (self_type *)local_18->children_[local_58 + -1];
    local_30->prev_leaf_ = psVar1;
    psVar1->next_leaf_ = local_30;
  }
  (in_RDI->istats_).key_domain_min_ = local_24;
  (in_RDI->istats_).key_domain_max_ = local_28;
  return;
}

Assistant:

void expand_root(T key, bool expand_left) {
    auto root = static_cast<model_node_type*>(root_node_);

    // Find the new bounds of the key domain.
    // Need to be careful to avoid overflows in the key type.
    T domain_size = istats_.key_domain_max_ - istats_.key_domain_min_;
    int expansion_factor;
    T new_domain_min = istats_.key_domain_min_;
    T new_domain_max = istats_.key_domain_max_;
    data_node_type* outermost_node;
    if (expand_left) {
      if constexpr (std::is_integral<T>::value){
        T key_difference = istats_.key_domain_min_ - std::min(key, get_min_key());
        expansion_factor = pow_2_round_up((key_difference + domain_size - 1) / domain_size + 1);
      }
      else{
        auto key_difference = static_cast<double>(istats_.key_domain_min_ -
                                                std::min(key, get_min_key()));
        expansion_factor = pow_2_round_up(static_cast<int>(
            std::ceil((key_difference + domain_size) / domain_size)));
      }
      // Check for overflow. To avoid overflow on signed types while doing
      // this check, we do comparisons using half of the relevant quantities.
      T half_expandable_domain =
          istats_.key_domain_max_ / 2 - std::numeric_limits<T>::lowest() / 2;
      T half_expanded_domain_size = expansion_factor / 2 * domain_size;
      if (half_expandable_domain < half_expanded_domain_size) {
        new_domain_min = std::numeric_limits<T>::lowest();
      } else {
        new_domain_min = istats_.key_domain_max_;
        new_domain_min -= half_expanded_domain_size;
        new_domain_min -= half_expanded_domain_size;
      }
      istats_.num_keys_at_last_left_domain_resize = stats_.num_keys;
      istats_.num_keys_below_key_domain = 0;
      outermost_node = first_data_node();
    } else {
      if constexpr (std::is_integral<T>::value){
        T key_difference = std::max(key, get_max_key()) - istats_.key_domain_max_;
        expansion_factor = pow_2_round_up((key_difference + domain_size - 1) / domain_size + 1);
      }
      else{
        auto key_difference = static_cast<double>(std::max(key, get_max_key()) -
                                                istats_.key_domain_max_);
        expansion_factor = pow_2_round_up(static_cast<int>(
            std::ceil((key_difference + domain_size) / domain_size)));
      }
      // Check for overflow. To avoid overflow on signed types while doing
      // this check, we do comparisons using half of the relevant quantities.
      T half_expandable_domain =
          std::numeric_limits<T>::max() / 2 - istats_.key_domain_min_ / 2;
      T half_expanded_domain_size = expansion_factor / 2 * domain_size;
      if (half_expandable_domain < half_expanded_domain_size) {
        new_domain_max = std::numeric_limits<T>::max();
      } else {
        new_domain_max = istats_.key_domain_min_;
        new_domain_max += half_expanded_domain_size;
        new_domain_max += half_expanded_domain_size;
      }
      istats_.num_keys_at_last_right_domain_resize = stats_.num_keys;
      istats_.num_keys_above_key_domain = 0;
      outermost_node = last_data_node();
    }
    assert(expansion_factor > 1);

    // Modify the root node appropriately
    int new_nodes_start;  // index of first pointer to a new node
    int new_nodes_end;    // exclusive
    if (static_cast<size_t>(root->num_children_) * expansion_factor <=
        static_cast<size_t>(derived_params_.max_fanout)) {
      // Expand root node
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += root->num_children_;

      int new_num_children = root->num_children_ * expansion_factor;
      auto new_children = new (pointer_allocator().allocate(new_num_children))
          AlexNode<T, P>*[new_num_children];
      int copy_start;
      if (expand_left) {
        copy_start = new_num_children - root->num_children_;
        new_nodes_start = 0;
        new_nodes_end = copy_start;
        root->model_.b_ += new_num_children - root->num_children_;
      } else {
        copy_start = 0;
        new_nodes_start = root->num_children_;
        new_nodes_end = new_num_children;
      }
      for (int i = 0; i < root->num_children_; i++) {
        new_children[copy_start + i] = root->children_[i];
      }
      pointer_allocator().deallocate(root->children_, root->num_children_);
      root->children_ = new_children;
      root->num_children_ = new_num_children;
    } else {
      // Create new root node
      auto new_root = new (model_node_allocator().allocate(1))
          model_node_type(static_cast<short>(root->level_ - 1), allocator_);
      new_root->model_.a_ = root->model_.a_ / root->num_children_;
      new_root->model_.b_ = root->model_.b_ / root->num_children_;
      if (expand_left) {
        new_root->model_.b_ += expansion_factor - 1;
      }
      new_root->num_children_ = expansion_factor;
      new_root->children_ = new (pointer_allocator().allocate(expansion_factor))
          AlexNode<T, P>*[expansion_factor];
      if (expand_left) {
        new_root->children_[expansion_factor - 1] = root;
        new_nodes_start = 0;
      } else {
        new_root->children_[0] = root;
        new_nodes_start = 1;
      }
      new_nodes_end = new_nodes_start + expansion_factor - 1;
      root_node_ = new_root;
      update_superroot_pointer();
      root = new_root;
    }
    // Determine if new nodes represent a range outside the key type's domain.
    // This happens when we're preventing overflows.
    int in_bounds_new_nodes_start = new_nodes_start;
    int in_bounds_new_nodes_end = new_nodes_end;
    if (expand_left) {
      in_bounds_new_nodes_start =
          std::max(new_nodes_start, root->model_.predict(new_domain_min));
    } else {
      in_bounds_new_nodes_end =
          std::min(new_nodes_end, root->model_.predict(new_domain_max) + 1);
    }

    // Fill newly created child pointers of the root node with new data nodes.
    // To minimize empty new data nodes, we create a new data node per n child
    // pointers, where n is the number of pointers to existing nodes.
    // Requires reassigning some keys from the outermost pre-existing data node
    // to the new data nodes.
    int n = root->num_children_ - (new_nodes_end - new_nodes_start);
    assert(root->num_children_ % n == 0);
    auto new_node_duplication_factor =
        static_cast<uint8_t>(log_2_round_down(n));
    if (expand_left) {
      T left_boundary_value = istats_.key_domain_min_;
      int left_boundary = outermost_node->lower_bound(left_boundary_value);
      data_node_type* next = outermost_node;
      for (int i = new_nodes_end; i > new_nodes_start; i -= n) {
        // if (i <= in_bounds_new_nodes_start) {
        //   // Do not initialize nodes that fall outside the key type's domain
        //   break;
        // }
        int right_boundary = left_boundary;
        if (i - n <= in_bounds_new_nodes_start) {
          left_boundary = 0;
        } else {
          left_boundary_value -= domain_size;
          left_boundary = outermost_node->lower_bound(left_boundary_value);
        }
        data_node_type* new_node = bulk_load_leaf_node_from_existing(
            outermost_node, left_boundary, right_boundary, true);
        new_node->level_ = static_cast<short>(root->level_ + 1);
        new_node->duplication_factor_ = new_node_duplication_factor;
        if (next) {
          next->prev_leaf_ = new_node;
        }
        new_node->next_leaf_ = next;
        next = new_node;
        for (int j = i - 1; j >= i - n; j--) {
          root->children_[j] = new_node;
        }
      }
    } else {
      T right_boundary_value = istats_.key_domain_max_;
      int right_boundary = outermost_node->lower_bound(right_boundary_value);
      data_node_type* prev = nullptr;
      for (int i = new_nodes_start; i < new_nodes_end; i += n) {
        // if (i >= in_bounds_new_nodes_end) {
        //   // Do not initialize nodes that fall outside the key type's domain
        //   break;
        // }
        int left_boundary = right_boundary;
        if (i + n >= in_bounds_new_nodes_end) {
          right_boundary = outermost_node->data_capacity_;
        } else {
          right_boundary_value += domain_size;
          right_boundary = outermost_node->lower_bound(right_boundary_value);
        }
        data_node_type* new_node = bulk_load_leaf_node_from_existing(
            outermost_node, left_boundary, right_boundary, true);
        new_node->level_ = static_cast<short>(root->level_ + 1);
        new_node->duplication_factor_ = new_node_duplication_factor;
        if (prev) {
          prev->next_leaf_ = new_node;
        }
        new_node->prev_leaf_ = prev;
        prev = new_node;
        for (int j = i; j < i + n; j++) {
          root->children_[j] = new_node;
        }
      }
    }

    // Connect leaf nodes and remove reassigned keys from outermost pre-existing
    // node.
    if (expand_left) {
      outermost_node->erase_range(new_domain_min, istats_.key_domain_min_);
      auto last_new_leaf =
          static_cast<data_node_type*>(root->children_[new_nodes_end - 1]);
      outermost_node->prev_leaf_ = last_new_leaf;
      last_new_leaf->next_leaf_ = outermost_node;
    } else {
      outermost_node->erase_range(istats_.key_domain_max_, new_domain_max,
                                  true);
      auto first_new_leaf =
          static_cast<data_node_type*>(root->children_[new_nodes_start]);
      outermost_node->next_leaf_ = first_new_leaf;
      first_new_leaf->prev_leaf_ = outermost_node;
    }

    istats_.key_domain_min_ = new_domain_min;
    istats_.key_domain_max_ = new_domain_max;
  }